

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O2

void __thiscall
TimedMutexTest_TryLockFor_Test<yamc::posix::native_recursive_mutex>::TimedMutexTest_TryLockFor_Test
          (TimedMutexTest_TryLockFor_Test<yamc::posix::native_recursive_mutex> *this)

{
  TimedMutexTest<yamc::posix::native_recursive_mutex>::TimedMutexTest
            (&this->super_TimedMutexTest<yamc::posix::native_recursive_mutex>);
  (this->super_TimedMutexTest<yamc::posix::native_recursive_mutex>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_00272690;
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockFor)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock_for(TEST_NOT_TIMEOUT)) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}